

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HopcroftKarpAlgorithm.cpp
# Opt level: O3

void __thiscall
BoxNesting::HopcroftKarpAlgorithm::HopcroftKarpAlgorithm
          (HopcroftKarpAlgorithm *this,
          vector<BoxNesting::Box,_std::allocator<BoxNesting::Box>_> *boxes)

{
  vector<short,std::allocator<short>> *this_00;
  pointer pBVar1;
  iterator __position;
  pointer pvVar2;
  bool bVar3;
  long lVar4;
  short sVar5;
  short local_2a;
  
  (this->graph).
  super__Vector_base<std::vector<short,_std::allocator<short>_>,_std::allocator<std::vector<short,_std::allocator<short>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->graph).
  super__Vector_base<std::vector<short,_std::allocator<short>_>,_std::allocator<std::vector<short,_std::allocator<short>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->graph).
  super__Vector_base<std::vector<short,_std::allocator<short>_>,_std::allocator<std::vector<short,_std::allocator<short>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->pairsLeft).super__Vector_base<short,_std::allocator<short>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->pairsLeft).super__Vector_base<short,_std::allocator<short>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->pairsLeft).super__Vector_base<short,_std::allocator<short>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->pairsRight).super__Vector_base<short,_std::allocator<short>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->pairsRight).super__Vector_base<short,_std::allocator<short>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->pairsRight).super__Vector_base<short,_std::allocator<short>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->distances).super__Vector_base<short,_std::allocator<short>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->distances).super__Vector_base<short,_std::allocator<short>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->distances).super__Vector_base<short,_std::allocator<short>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  sVar5 = (short)((long)(boxes->
                        super__Vector_base<BoxNesting::Box,_std::allocator<BoxNesting::Box>_>).
                        _M_impl.super__Vector_impl_data._M_finish -
                  (long)(boxes->
                        super__Vector_base<BoxNesting::Box,_std::allocator<BoxNesting::Box>_>).
                        _M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555;
  this->leftVerticesCount = sVar5;
  this->rightVerticesCount = sVar5;
  std::
  vector<std::vector<short,_std::allocator<short>_>,_std::allocator<std::vector<short,_std::allocator<short>_>_>_>
  ::resize(&this->graph,(long)sVar5 + 1);
  if (0 < this->leftVerticesCount) {
    sVar5 = 1;
    lVar4 = 1;
    do {
      std::vector<short,_std::allocator<short>_>::reserve
                ((this->graph).
                 super__Vector_base<std::vector<short,_std::allocator<short>_>,_std::allocator<std::vector<short,_std::allocator<short>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start + lVar4,
                 (long)this->rightVerticesCount + 1);
      local_2a = 1;
      if (0 < this->rightVerticesCount) {
        do {
          pBVar1 = (boxes->super__Vector_base<BoxNesting::Box,_std::allocator<BoxNesting::Box>_>).
                   _M_impl.super__Vector_impl_data._M_start;
          bVar3 = Box::operator<(pBVar1 + lVar4 + -1,pBVar1 + (long)local_2a + -1);
          if (bVar3) {
            this_00 = (vector<short,std::allocator<short>> *)
                      ((this->graph).
                       super__Vector_base<std::vector<short,_std::allocator<short>_>,_std::allocator<std::vector<short,_std::allocator<short>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start + lVar4);
            __position._M_current = *(short **)(this_00 + 8);
            if (__position._M_current == *(short **)(this_00 + 0x10)) {
              std::vector<short,std::allocator<short>>::_M_realloc_insert<short&>
                        (this_00,__position,&local_2a);
            }
            else {
              *__position._M_current = local_2a;
              *(short **)(this_00 + 8) = __position._M_current + 1;
            }
          }
          local_2a = local_2a + 1;
        } while (local_2a <= this->rightVerticesCount);
      }
      pvVar2 = (this->graph).
               super__Vector_base<std::vector<short,_std::allocator<short>_>,_std::allocator<std::vector<short,_std::allocator<short>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      if (*(pointer *)
           ((long)&pvVar2[lVar4].super__Vector_base<short,_std::allocator<short>_>._M_impl + 0x10)
          != *(pointer *)
              ((long)&pvVar2[lVar4].super__Vector_base<short,_std::allocator<short>_>._M_impl + 8))
      {
        std::__shrink_to_fit_aux<std::vector<short,_std::allocator<short>_>,_true>::_S_do_it
                  (pvVar2 + lVar4);
      }
      sVar5 = sVar5 + 1;
      lVar4 = (long)sVar5;
    } while (sVar5 <= this->leftVerticesCount);
  }
  return;
}

Assistant:

HopcroftKarpAlgorithm::HopcroftKarpAlgorithm(const std::vector<Box>& boxes)
{
	// In the boxes case the left and right vertices are the same amount since
	// they are the amount of boxes. Since it never exceeds 5000 we can easily
	// cast here
	this->leftVerticesCount = static_cast<int16_t>(boxes.size());
	this->rightVerticesCount = this->leftVerticesCount;

	this->graph.resize(this->leftVerticesCount + 1);

	// This algorithm actually only requires the adjacency list
	// of the left part of the graph so we only construct
	// that. This is because in our boxes case the partitions
	// contain the same amount of vertices.
	for (int16_t i = 1; i <= this->leftVerticesCount; ++i) {
		this->graph[i].reserve(this->rightVerticesCount + 1);
		for (int16_t j = 1; j <= this->rightVerticesCount; ++j) {
			if (boxes[i - 1] < boxes[j - 1]) {
				this->graph[i].emplace_back(j);
			}
		}
		this->graph[i].shrink_to_fit();
	}
}